

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O2

ostream * vk::operator<<(ostream *str,DebugReportMessage *message)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  Hex<8UL> hex;
  Bitfield<32UL> local_30;
  
  uVar1 = message->flags;
  if ((anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits);
    if (iVar2 != 0) {
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._0_8_ = 1;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._8_8_ =
           (long)"VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO" + 0x2d;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._16_8_ = 2;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._24_8_ =
           anon_var_dwarf_1829406;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._32_8_ = 4;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._40_8_ =
           (long)"GL_DEBUG_TYPE_PERFORMANCE" + 0xe;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._48_8_ = 8;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._56_8_ =
           (long)"GL_DEBUG_TYPE_ERROR" + 0xe;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._64_8_ = 0x10;
      (anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits._72_8_ =
           anon_var_dwarf_182943c;
      __cxa_guard_release(&(anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits);
    }
  }
  local_30.m_begin = (BitDesc *)(anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits;
  local_30.m_end = (BitDesc *)&(anonymous_namespace)::shortDebugFlagsStr(unsigned_int)::s_bits;
  local_30.m_value = (ulong)uVar1;
  poVar3 = tcu::Format::Bitfield<32UL>::toStream(&local_30,str);
  poVar3 = std::operator<<(poVar3,": ");
  poVar3 = std::operator<<(poVar3,(string *)&message->message);
  poVar3 = std::operator<<(poVar3," (code ");
  hex.value._4_4_ = 0;
  hex.value._0_4_ = message->messageCode;
  tcu::Format::operator<<(poVar3,hex);
  if ((message->layerPrefix)._M_string_length != 0) {
    poVar3 = std::operator<<(str," from ");
    std::operator<<(poVar3,(string *)&message->layerPrefix);
  }
  poVar3 = std::operator<<(str," at ");
  local_30.m_value = (deUint64)anon_unknown_0::getShortObjectTypeName;
  local_30.m_begin = (BitDesc *)CONCAT44(local_30.m_begin._4_4_,message->objectType);
  poVar3 = tcu::Format::Enum<vk::VkDebugReportObjectTypeEXT,_4UL>::toStream
                     ((Enum<vk::VkDebugReportObjectTypeEXT,_4UL> *)&local_30,poVar3);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,")");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DebugReportMessage& message)
{
	str << shortDebugFlagsStr(message.flags) << ": "
		<< message.message
		<< " (code " << tcu::toHex(message.messageCode);

	if (!message.layerPrefix.empty())
		str << " from " << message.layerPrefix;

	str << " at " << shortObjectTypeStr(message.objectType) << ":" << message.location << ")";

	return str;
}